

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O2

uchar * SOIL_load_image(char *filename,int *width,int *height,int *channels,int force_channels)

{
  stbi_uc *psVar1;
  
  psVar1 = stbi_load(filename,width,height,channels,force_channels);
  if (psVar1 == (stbi_uc *)0x0) {
    result_string_pointer = stbi_failure_reason();
  }
  else {
    result_string_pointer = "Image loaded";
  }
  return psVar1;
}

Assistant:

unsigned char*
	SOIL_load_image
	(
		const char *filename,
		int *width, int *height, int *channels,
		int force_channels
	)
{
	unsigned char *result = stbi_load( filename,
			width, height, channels, force_channels );
	if( result == NULL )
	{
		result_string_pointer = stbi_failure_reason();
	} else
	{
		result_string_pointer = "Image loaded";
	}
	return result;
}